

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

void __thiscall cmCTestSubmitCommand::BindArguments(cmCTestSubmitCommand *this)

{
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  cmCTestSubmitCommand *local_10;
  cmCTestSubmitCommand *this_local;
  
  local_10 = this;
  if ((this->CDashUpload & 1U) == 0) {
    local_40 = (string_view)::cm::operator____s("PARTS",5);
    cmArgumentParser<void>::
    Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
               (static_string_view)local_40,&this->Parts);
    local_50 = (string_view)::cm::operator____s("FILES",5);
    cmArgumentParser<void>::
    Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
               (static_string_view)local_50,&this->Files);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_20,"CDASH_UPLOAD");
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,local_20,
               &this->CDashUploadFile);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"CDASH_UPLOAD_TYPE");
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,local_30,
               &this->CDashUploadType);
  }
  local_60 = (string_view)::cm::operator____s("BUILD_ID",8);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
             (static_string_view)local_60,&this->BuildID);
  local_70 = (string_view)::cm::operator____s("HTTPHEADER",10);
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
             (static_string_view)local_70,&this->HttpHeaders);
  local_80 = (string_view)::cm::operator____s("RETRY_COUNT",0xb);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
             (static_string_view)local_80,&this->RetryCount);
  local_90 = (string_view)::cm::operator____s("RETRY_DELAY",0xb);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
             (static_string_view)local_90,&this->RetryDelay);
  local_a0 = (string_view)::cm::operator____s("SUBMIT_URL",10);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,
             (static_string_view)local_a0,&this->SubmitURL);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"INTERNAL_TEST_CHECKSUM");
  cmArgumentParser<void>::Bind<bool>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,local_b0,
             &this->InternalTest);
  cmCTestHandlerCommand::BindArguments(&this->super_cmCTestHandlerCommand);
  return;
}

Assistant:

void cmCTestSubmitCommand::BindArguments()
{
  if (this->CDashUpload) {
    // Arguments specific to the CDASH_UPLOAD signature.
    this->Bind("CDASH_UPLOAD", this->CDashUploadFile);
    this->Bind("CDASH_UPLOAD_TYPE", this->CDashUploadType);
  } else {
    // Arguments that cannot be used with CDASH_UPLOAD.
    this->Bind("PARTS"_s, this->Parts);
    this->Bind("FILES"_s, this->Files);
  }
  // Arguments used by both modes.
  this->Bind("BUILD_ID"_s, this->BuildID);
  this->Bind("HTTPHEADER"_s, this->HttpHeaders);
  this->Bind("RETRY_COUNT"_s, this->RetryCount);
  this->Bind("RETRY_DELAY"_s, this->RetryDelay);
  this->Bind("SUBMIT_URL"_s, this->SubmitURL);
  this->Bind("INTERNAL_TEST_CHECKSUM", this->InternalTest);

  // Look for other arguments.
  this->cmCTestHandlerCommand::BindArguments();
}